

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O0

void run_ellswift_bench(int iters,int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  char **argv_00;
  int in_ESI;
  int d;
  bench_ellswift_data data;
  uint in_stack_ffffffffffffbfa0;
  int in_stack_ffffffffffffbfb0;
  int in_stack_ffffffffffffbfbc;
  void *in_stack_ffffffffffffbfc0;
  _func_void_void_ptr_int *in_stack_ffffffffffffbfc8;
  _func_void_void_ptr *in_stack_ffffffffffffbfd0;
  _func_void_void_ptr_int *in_stack_ffffffffffffbfd8;
  char *in_stack_ffffffffffffbfe0;
  int in_stack_ffffffffffffbff0;
  
  uVar1 = (uint)(in_ESI == 1);
  argv_00 = (char **)secp256k1_context_create(1);
  if (uVar1 == 0) {
    iVar2 = have_flag(in_stack_ffffffffffffbfb0,argv_00,(char *)(ulong)in_stack_ffffffffffffbfa0);
    if (iVar2 != 0) goto LAB_001023c7;
    iVar2 = have_flag(in_stack_ffffffffffffbfb0,argv_00,
                      (char *)CONCAT44(uVar1,in_stack_ffffffffffffbfa0));
    if (iVar2 != 0) goto LAB_001023c7;
    iVar2 = have_flag(in_stack_ffffffffffffbfb0,argv_00,
                      (char *)CONCAT44(uVar1,in_stack_ffffffffffffbfa0));
    if (iVar2 != 0) goto LAB_001023c7;
  }
  else {
LAB_001023c7:
    run_benchmark(in_stack_ffffffffffffbfe0,in_stack_ffffffffffffbfd8,in_stack_ffffffffffffbfd0,
                  in_stack_ffffffffffffbfc8,in_stack_ffffffffffffbfc0,in_stack_ffffffffffffbfbc,
                  in_stack_ffffffffffffbff0);
  }
  if (uVar1 == 0) {
    iVar2 = have_flag(in_stack_ffffffffffffbfb0,argv_00,(char *)(ulong)in_stack_ffffffffffffbfa0);
    if (iVar2 != 0) goto LAB_0010245f;
    iVar2 = have_flag(in_stack_ffffffffffffbfb0,argv_00,
                      (char *)CONCAT44(uVar1,in_stack_ffffffffffffbfa0));
    if (iVar2 != 0) goto LAB_0010245f;
    iVar2 = have_flag(in_stack_ffffffffffffbfb0,argv_00,
                      (char *)CONCAT44(uVar1,in_stack_ffffffffffffbfa0));
    if (iVar2 != 0) goto LAB_0010245f;
  }
  else {
LAB_0010245f:
    run_benchmark(in_stack_ffffffffffffbfe0,in_stack_ffffffffffffbfd8,in_stack_ffffffffffffbfd0,
                  in_stack_ffffffffffffbfc8,in_stack_ffffffffffffbfc0,in_stack_ffffffffffffbfbc,
                  in_stack_ffffffffffffbff0);
  }
  if (uVar1 == 0) {
    iVar2 = have_flag(in_stack_ffffffffffffbfb0,argv_00,(char *)(ulong)in_stack_ffffffffffffbfa0);
    if (iVar2 != 0) goto LAB_001024f7;
    iVar2 = have_flag(in_stack_ffffffffffffbfb0,argv_00,
                      (char *)CONCAT44(uVar1,in_stack_ffffffffffffbfa0));
    if (iVar2 != 0) goto LAB_001024f7;
    iVar2 = have_flag(in_stack_ffffffffffffbfb0,argv_00,
                      (char *)CONCAT44(uVar1,in_stack_ffffffffffffbfa0));
    if (iVar2 != 0) goto LAB_001024f7;
  }
  else {
LAB_001024f7:
    run_benchmark(in_stack_ffffffffffffbfe0,in_stack_ffffffffffffbfd8,in_stack_ffffffffffffbfd0,
                  in_stack_ffffffffffffbfc8,in_stack_ffffffffffffbfc0,in_stack_ffffffffffffbfbc,
                  in_stack_ffffffffffffbff0);
  }
  if (uVar1 == 0) {
    iVar2 = have_flag(in_stack_ffffffffffffbfb0,argv_00,(char *)(ulong)in_stack_ffffffffffffbfa0);
    if (iVar2 == 0) {
      iVar2 = have_flag(in_stack_ffffffffffffbfb0,argv_00,
                        (char *)CONCAT44(uVar1,in_stack_ffffffffffffbfa0));
      if (iVar2 == 0) {
        iVar2 = have_flag(in_stack_ffffffffffffbfb0,argv_00,
                          (char *)CONCAT44(uVar1,in_stack_ffffffffffffbfa0));
        if (iVar2 == 0) goto LAB_001025c0;
      }
    }
  }
  run_benchmark(in_stack_ffffffffffffbfe0,in_stack_ffffffffffffbfd8,in_stack_ffffffffffffbfd0,
                in_stack_ffffffffffffbfc8,in_stack_ffffffffffffbfc0,in_stack_ffffffffffffbfbc,
                in_stack_ffffffffffffbff0);
LAB_001025c0:
  secp256k1_context_destroy(argv_00);
  return;
}

Assistant:

void run_ellswift_bench(int iters, int argc, char **argv) {
    bench_ellswift_data data;
    int d = argc == 1;

    /* create a context with signing capabilities */
    data.ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);

    if (d || have_flag(argc, argv, "ellswift") || have_flag(argc, argv, "encode") || have_flag(argc, argv, "ellswift_encode")) run_benchmark("ellswift_encode", bench_ellswift_encode, bench_ellswift_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "ellswift") || have_flag(argc, argv, "decode") || have_flag(argc, argv, "ellswift_decode")) run_benchmark("ellswift_decode", bench_ellswift_decode, bench_ellswift_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "ellswift") || have_flag(argc, argv, "keygen") || have_flag(argc, argv, "ellswift_keygen")) run_benchmark("ellswift_keygen", bench_ellswift_create, bench_ellswift_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "ellswift") || have_flag(argc, argv, "ecdh") || have_flag(argc, argv, "ellswift_ecdh")) run_benchmark("ellswift_ecdh", bench_ellswift_xdh, bench_ellswift_setup, NULL, &data, 10, iters);

    secp256k1_context_destroy(data.ctx);
}